

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postscript.h
# Opt level: O0

void __thiscall
Gecko::PostScript::PostScript(PostScript *this,uint nodes,FILE *file,uint wx,uint wy)

{
  uint in_ECX;
  FILE *in_RDX;
  uint in_ESI;
  Device *in_RDI;
  uint in_R8D;
  
  Device::Device(in_RDI);
  in_RDI->_vptr_Device = (_func_int **)&PTR__PostScript_00110bf8;
  in_RDI[1]._vptr_Device = (_func_int **)in_RDX;
  *(undefined4 *)&in_RDI[4]._vptr_Device = 1;
  fprintf(in_RDX,"%%!PS-Adobe-3.0 EPSF-2.0\n");
  fprintf(in_RDX,"%%%%BoundingBox: 0 0 %u %u\n",(ulong)in_ECX,(ulong)in_R8D);
  fprintf(in_RDX,"100 dict begin\n");
  fprintf(in_RDX,"/Q { setrgbcolor rectfill } bind def\n");
  fprintf(in_RDX,"%% circle: x y r\n");
  fprintf(in_RDX,"/c { newpath 0 360 arc stroke } bind def\n");
  fprintf(in_RDX,"%% disc: x y r\n");
  fprintf(in_RDX,"/d { newpath 0 360 arc fill } bind def\n");
  fprintf(in_RDX,"%% node: xpos radius grayfill n\n");
  fprintf(in_RDX,"/n { 0.125 setlinewidth setgray 0 exch 3 copy d 0 setgray c } bind def\n");
  fprintf(in_RDX,"/a { newpath setlinewidth exch 0 moveto 0 lineto stroke } bind def\n");
  fprintf(in_RDX,"%% arc: x0 y0 x1 y1 x2 y2 r\n");
  fprintf(in_RDX,"/A { newpath setlinewidth 7 -2 roll moveto arct stroke } bind def\n");
  in_RDI[2]._vptr_Device = (_func_int **)((double)in_R8D * 0.5);
  in_RDI[3]._vptr_Device = (_func_int **)((double)in_ECX / (double)in_ESI);
  return;
}

Assistant:

PostScript(uint nodes, FILE* file = stdout, uint wx = 576, uint wy = 576) : file(file), page(1)
  {
    fprintf(file, "%%!PS-Adobe-3.0 EPSF-2.0\n");
    fprintf(file, "%%%%BoundingBox: 0 0 %u %u\n", wx, wy);
    fprintf(file, "100 dict begin\n");
    fprintf(file, "/Q { setrgbcolor rectfill } bind def\n");
    fprintf(file, "%% circle: x y r\n");
    fprintf(file, "/c { newpath 0 360 arc stroke } bind def\n");
    fprintf(file, "%% disc: x y r\n");
    fprintf(file, "/d { newpath 0 360 arc fill } bind def\n");
    fprintf(file, "%% node: xpos radius grayfill n\n");
    fprintf(file, "/n { 0.125 setlinewidth setgray 0 exch 3 copy d 0 setgray c } bind def\n");
    fprintf(file, "/a { newpath setlinewidth exch 0 moveto 0 lineto stroke } bind def\n");
    fprintf(file, "%% arc: x0 y0 x1 y1 x2 y2 r\n");
    fprintf(file, "/A { newpath setlinewidth 7 -2 roll moveto arct stroke } bind def\n");
    origin = 0.5 * wy;
    scale = double(wx) / nodes;
  }